

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O0

MainFunc __thiscall
capnp::compiler::anon_unknown_0::EvolutionTestMain::getMain(EvolutionTestMain *this)

{
  EvolutionTestMain *context;
  StringPtr extendedDescription;
  StringPtr helpText;
  StringPtr argumentTitle;
  initializer_list<kj::MainBuilder::OptionName> names;
  StringPtr briefDescription;
  StringPtr version;
  MainBuilder *this_00;
  Type *func;
  Iface *extraout_RDX;
  BoundMethod<capnp::compiler::(anonymous_namespace)::EvolutionTestMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_evolution_test_c__:858:37),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_evolution_test_c__:858:37)>
  *in_RSI;
  MainFunc MVar1;
  undefined1 local_f2 [2];
  BoundMethod<capnp::compiler::(anonymous_namespace)::EvolutionTestMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_evolution_test_c__:860:27),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_evolution_test_c__:860:27)>
  local_f0;
  Function<kj::MainBuilder::Validity_()> local_e0;
  StringPtr local_d0;
  StringPtr local_c0;
  undefined1 local_aa [2];
  BoundMethod<capnp::compiler::(anonymous_namespace)::EvolutionTestMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_evolution_test_c__:858:37),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_evolution_test_c__:858:37)>
  local_a8;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_98 [2];
  OptionName local_78;
  iterator local_68;
  size_type local_60;
  StringPtr local_58;
  StringPtr local_48;
  StringPtr local_38;
  MainBuilder local_28;
  EvolutionTestMain *this_local;
  
  context = in_RSI->t;
  this_local = this;
  kj::StringPtr::StringPtr(&local_38,"(unknown version)");
  kj::StringPtr::StringPtr
            (&local_48,
             "Integration test / fuzzer which randomly modifies schemas is backwards-compatible ways and verifies that they do actually remain compatible."
            );
  kj::StringPtr::StringPtr(&local_58,(void *)0x0);
  version.content.size_ = local_38.content.size_;
  version.content.ptr = local_38.content.ptr;
  briefDescription.content.size_ = local_48.content.size_;
  briefDescription.content.ptr = local_48.content.ptr;
  extendedDescription.content.size_ = local_58.content.size_;
  extendedDescription.content.ptr = local_58.content.ptr;
  kj::MainBuilder::MainBuilder
            (&local_28,(ProcessContext *)context,version,briefDescription,extendedDescription);
  kj::MainBuilder::OptionName::OptionName(&local_78,"seed");
  local_68 = &local_78;
  local_60 = 1;
  local_a8.t = (EvolutionTestMain *)
               kj::_::
               boundMethod<capnp::compiler::(anonymous_namespace)::EvolutionTestMain&,capnp::compiler::(anonymous_namespace)::EvolutionTestMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::(anonymous_namespace)::EvolutionTestMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_2_>
                         (in_RSI,(_ *)(local_aa + 1),(EvolutionTestMain *)local_aa,
                          (Type *)local_38.content.size_,(Type *)local_48.content.ptr);
  kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::
  Function<kj::_::BoundMethod<capnp::compiler::(anonymous_namespace)::EvolutionTestMain&,capnp::compiler::(anonymous_namespace)::EvolutionTestMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::(anonymous_namespace)::EvolutionTestMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_2_>>
            ((Function<kj::MainBuilder::Validity(kj::StringPtr)> *)local_98,&local_a8);
  kj::StringPtr::StringPtr(&local_c0,"<num>");
  kj::StringPtr::StringPtr
            (&local_d0,"Set random number seed to <num>.  By default, time() is used.");
  names._M_len = local_60;
  names._M_array = local_68;
  argumentTitle.content.size_ = local_c0.content.size_;
  argumentTitle.content.ptr = local_c0.content.ptr;
  func = (Type *)local_98;
  helpText.content.size_ = local_d0.content.size_;
  helpText.content.ptr = local_d0.content.ptr;
  this_00 = kj::MainBuilder::addOptionWithArg
                      (&local_28,names,(Function<kj::MainBuilder::Validity_(kj::StringPtr)> *)func,
                       argumentTitle,helpText);
  local_f0.t = (EvolutionTestMain *)
               kj::_::
               boundMethod<capnp::compiler::(anonymous_namespace)::EvolutionTestMain&,capnp::compiler::(anonymous_namespace)::EvolutionTestMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_3_,capnp::compiler::(anonymous_namespace)::EvolutionTestMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_4_>
                         ((BoundMethod<capnp::compiler::(anonymous_namespace)::EvolutionTestMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_evolution_test_c__:860:27),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_evolution_test_c__:860:27)>
                           *)in_RSI,(_ *)(local_f2 + 1),(EvolutionTestMain *)local_f2,func,
                          (Type *)local_c0.content.ptr);
  kj::Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<capnp::compiler::(anonymous_namespace)::EvolutionTestMain&,capnp::compiler::(anonymous_namespace)::EvolutionTestMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_3_,capnp::compiler::(anonymous_namespace)::EvolutionTestMain::getMain()::_lambda(auto:1&,(auto:2&&)___)_4_>>
            ((Function<kj::MainBuilder::Validity()> *)&local_e0,&local_f0);
  kj::MainBuilder::callAfterParsing(this_00,&local_e0);
  kj::MainBuilder::build((MainBuilder *)this);
  kj::Function<kj::MainBuilder::Validity_()>::~Function(&local_e0);
  kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::~Function(local_98);
  kj::MainBuilder::~MainBuilder(&local_28);
  MVar1.impl.ptr = extraout_RDX;
  MVar1.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar1.impl;
}

Assistant:

kj::MainFunc getMain() {
    return kj::MainBuilder(context, "(unknown version)",
        "Integration test / fuzzer which randomly modifies schemas is backwards-compatible ways "
        "and verifies that they do actually remain compatible.")
        .addOptionWithArg({"seed"}, KJ_BIND_METHOD(*this, setSeed), "<num>",
            "Set random number seed to <num>.  By default, time() is used.")
        .callAfterParsing(KJ_BIND_METHOD(*this, run))
        .build();
  }